

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::VerifyArrayValueInfoForTracking
          (GlobOpt *this,ValueInfo *valueInfo,bool isJsArray,BasicBlock *block,
          bool ignoreKnownImplicitCalls)

{
  ValueType *this_00;
  ImplicitCallFlags IVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ArrayValueInfo *pAVar6;
  Loop *loop;
  
  if (valueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x320c,"(valueInfo)","valueInfo");
    if (!bVar4) goto LAB_0043e241;
    *puVar5 = 0;
  }
  this_00 = &valueInfo->super_ValueType;
  bVar4 = ValueType::IsAnyOptimizedArray(this_00);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x320d,"(valueInfo->IsAnyOptimizedArray())",
                       "valueInfo->IsAnyOptimizedArray()");
    if (!bVar4) goto LAB_0043e241;
    *puVar5 = 0;
  }
  bVar4 = ValueType::IsArrayOrObjectWithArray(this_00);
  if (bVar4 != isJsArray) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x320e,"(isJsArray == valueInfo->IsArrayOrObjectWithArray())",
                       "isJsArray == valueInfo->IsArrayOrObjectWithArray()");
    if (!bVar4) goto LAB_0043e241;
    *puVar5 = 0;
  }
  bVar4 = ValueType::IsOptimizedTypedArray(this_00);
  if (bVar4 == isJsArray) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x320f,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                       "!isJsArray == valueInfo->IsOptimizedTypedArray()");
    if (!bVar4) goto LAB_0043e241;
    *puVar5 = 0;
  }
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3210,"(block)","block");
    if (!bVar4) goto LAB_0043e241;
    *puVar5 = 0;
  }
  pBVar2 = block->next;
  if ((pBVar2 == (BasicBlock *)0x0) || ((*(ushort *)&pBVar2->field_0x18 & 5) != 4)) {
    loop = block->loop;
  }
  else {
    loop = pBVar2->loop;
    if (loop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3218,"(implicitCallsLoop)","implicitCallsLoop");
      if (!bVar4) goto LAB_0043e241;
      *puVar5 = 0;
    }
    if (loop->landingPad != block) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3219,"(implicitCallsLoop->landingPad == block)",
                         "implicitCallsLoop->landingPad == block");
      if (!bVar4) goto LAB_0043e241;
      *puVar5 = 0;
    }
  }
  if (isJsArray) {
    bVar4 = DoArrayCheckHoist(this,(ValueType)
                                   *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                    &(this_00->field_0).field_0,loop,(Instr *)0x0);
    if (bVar4) goto LAB_0043e0c4;
    if (ignoreKnownImplicitCalls) {
      if (loop == (Loop *)0x0) {
        IVar1 = this->func->m_fg->implicitCallFlags;
        if ((IVar1 & ~ImplicitCall_Accessor) == ImplicitCall_HasNoInfo &&
            IVar1 != ImplicitCall_HasNoInfo) goto LAB_0043e073;
      }
      else {
        bVar4 = ImplicitCallFlagsAllowOpts(loop);
        if (bVar4) goto LAB_0043e073;
      }
    }
    else {
LAB_0043e073:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3226,
                         "(!isJsArray || DoArrayCheckHoist(valueInfo->Type(), implicitCallsLoop) || ( ignoreKnownImplicitCalls && !(implicitCallsLoop ? ImplicitCallFlagsAllowOpts(implicitCallsLoop) : ImplicitCallFlagsAllowOpts(func)) ))"
                         ,
                         "!isJsArray || DoArrayCheckHoist(valueInfo->Type(), implicitCallsLoop) || ( ignoreKnownImplicitCalls && !(implicitCallsLoop ? ImplicitCallFlagsAllowOpts(implicitCallsLoop) : ImplicitCallFlagsAllowOpts(func)) )"
                        );
      if (!bVar4) goto LAB_0043e241;
      *puVar5 = 0;
    }
LAB_0043e0c4:
    bVar4 = ValueType::HasNoMissingValues(this_00);
    if ((bVar4) && ((this->field_0xf5 & 0x80) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3227,
                         "(!(isJsArray && valueInfo->HasNoMissingValues() && !DoArrayMissingValueCheckHoist()))"
                         ,
                         "!(isJsArray && valueInfo->HasNoMissingValues() && !DoArrayMissingValueCheckHoist())"
                        );
      if (!bVar4) goto LAB_0043e241;
      *puVar5 = 0;
    }
  }
  bVar4 = ValueInfo::IsArrayValueInfo(valueInfo);
  if ((bVar4) &&
     (((pAVar6 = ValueInfo::AsArrayValueInfo(valueInfo), pAVar6->headSegmentSym != (StackSym *)0x0
       || (pAVar6 = ValueInfo::AsArrayValueInfo(valueInfo),
          pAVar6->headSegmentLengthSym != (StackSym *)0x0)) &&
      (bVar4 = DoArraySegmentHoist(this,(ValueType)
                                        *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                         &(this_00->field_0).field_0), !bVar4)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3230,
                       "(!( valueInfo->IsArrayValueInfo() && ( valueInfo->AsArrayValueInfo()->HeadSegmentSym() || valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym() ) && !DoArraySegmentHoist(valueInfo->Type()) ))"
                       ,
                       "!( valueInfo->IsArrayValueInfo() && ( valueInfo->AsArrayValueInfo()->HeadSegmentSym() || valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym() ) && !DoArraySegmentHoist(valueInfo->Type()) )"
                      );
    if (!bVar4) goto LAB_0043e241;
    *puVar5 = 0;
  }
  if (((isJsArray) && (bVar4 = ValueInfo::IsArrayValueInfo(valueInfo), bVar4)) &&
     ((pAVar6 = ValueInfo::AsArrayValueInfo(valueInfo), pAVar6->lengthSym != (StackSym *)0x0 &&
      ((this->field_0xf6 & 4) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3244,
                       "(!( isJsArray && valueInfo->IsArrayValueInfo() && valueInfo->AsArrayValueInfo()->LengthSym() && !DoArrayLengthHoist() ))"
                       ,
                       "!( isJsArray && valueInfo->IsArrayValueInfo() && valueInfo->AsArrayValueInfo()->LengthSym() && !DoArrayLengthHoist() )"
                      );
    if (!bVar4) {
LAB_0043e241:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void
GlobOpt::VerifyArrayValueInfoForTracking(
    const ValueInfo *const valueInfo,
    const bool isJsArray,
    const BasicBlock *const block,
    const bool ignoreKnownImplicitCalls) const
{
    Assert(valueInfo);
    Assert(valueInfo->IsAnyOptimizedArray());
    Assert(isJsArray == valueInfo->IsArrayOrObjectWithArray());
    Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());
    Assert(block);

    Loop *implicitCallsLoop;
    if(block->next && !block->next->isDeleted && block->next->isLoopHeader)
    {
        // Since a loop's landing pad does not have user code, determine whether disabling implicit calls is allowed in the
        // landing pad based on the loop for which this block is the landing pad.
        implicitCallsLoop = block->next->loop;
        Assert(implicitCallsLoop);
        Assert(implicitCallsLoop->landingPad == block);
    }
    else
    {
        implicitCallsLoop = block->loop;
    }

    Assert(
        !isJsArray ||
        DoArrayCheckHoist(valueInfo->Type(), implicitCallsLoop) ||
        (
            ignoreKnownImplicitCalls &&
            !(implicitCallsLoop ? ImplicitCallFlagsAllowOpts(implicitCallsLoop) : ImplicitCallFlagsAllowOpts(func))
        ));
    Assert(!(isJsArray && valueInfo->HasNoMissingValues() && !DoArrayMissingValueCheckHoist()));
    Assert(
        !(
            valueInfo->IsArrayValueInfo() &&
            (
                valueInfo->AsArrayValueInfo()->HeadSegmentSym() ||
                valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()
            ) &&
            !DoArraySegmentHoist(valueInfo->Type())
        ));
#if 0
    // We can't assert here that there is only a head segment length sym if hoisting is allowed in the current block,
    // because we may have propagated the sym forward out of a loop, and hoisting may be allowed inside but not
    // outside the loop.
    Assert(
        isJsArray ||
        !valueInfo->IsArrayValueInfo() ||
        !valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym() ||
        DoTypedArraySegmentLengthHoist(implicitCallsLoop) ||
        ignoreKnownImplicitCalls ||
        (implicitCallsLoop ? ImplicitCallFlagsAllowOpts(implicitCallsLoop) : ImplicitCallFlagsAllowOpts(func))
        );
#endif
    Assert(
        !(
            isJsArray &&
            valueInfo->IsArrayValueInfo() &&
            valueInfo->AsArrayValueInfo()->LengthSym() &&
            !DoArrayLengthHoist()
        ));
}